

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O3

void Acec_ManPool(Gia_Man_t *p)

{
  void *__ptr;
  int iVar1;
  uint uVar2;
  Vec_Int_t *vAdds;
  Vec_Int_t *vRootBoxes;
  Vec_Wec_t *__ptr_00;
  long lVar3;
  char *pcVar4;
  int iVar5;
  Vec_Int_t *__ptr_01;
  long lVar6;
  timespec ts;
  timespec local_40;
  
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  vAdds = Ree_ManComputeCuts(p,(Vec_Int_t **)0x0,1);
  uVar2 = Ree_ManCountFadds(vAdds);
  printf("Detected %d FAs and %d HAs.  ",(ulong)uVar2,(ulong)(vAdds->nSize / 6 - uVar2));
  iVar5 = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%s =","Time");
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar6 + lVar3) / 1000000.0);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  uVar2 = Ree_ManCountFadds(vAdds);
  printf("Detected %d FAs and %d HAs.  ",(ulong)uVar2,(ulong)(vAdds->nSize / 6 - uVar2));
  iVar5 = 3;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar6 = -1;
  }
  else {
    lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(iVar5,"%s =","Time");
  Abc_Print(iVar5,"%9.2f sec\n",(double)(lVar6 + lVar3) / 1000000.0);
  vRootBoxes = Acec_ManPoolTopMost(p,vAdds);
  pcVar4 = "";
  if (1 < vRootBoxes->nSize) {
    pcVar4 = "s";
  }
  printf("Detected %d topmost adder%s.\n",(ulong)(uint)vRootBoxes->nSize,pcVar4);
  __ptr_00 = Gia_PolynCoreOrderArray(p,vAdds,vRootBoxes);
  if (0 < __ptr_00->nSize) {
    lVar6 = 4;
    lVar3 = 0;
    do {
      if (vRootBoxes->nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      printf("Adder %5d : Tree with %5d nodes.\n",(ulong)(uint)vRootBoxes->pArray[lVar3],
             (ulong)*(uint *)((long)&__ptr_00->pArray->nCap + lVar6));
      lVar3 = lVar3 + 1;
      lVar6 = lVar6 + 0x10;
    } while (lVar3 < __ptr_00->nSize);
  }
  iVar1 = __ptr_00->nCap;
  __ptr_01 = __ptr_00->pArray;
  if (iVar1 < 1) {
    if (__ptr_01 == (Vec_Int_t *)0x0) goto LAB_00677fc8;
  }
  else {
    lVar3 = 8;
    lVar6 = 0;
    do {
      __ptr = *(void **)((long)&__ptr_01->nCap + lVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        __ptr_01 = __ptr_00->pArray;
        *(undefined8 *)((long)&__ptr_01->nCap + lVar3) = 0;
        iVar1 = __ptr_00->nCap;
      }
      lVar6 = lVar6 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar6 < iVar1);
  }
  free(__ptr_01);
LAB_00677fc8:
  free(__ptr_00);
  if (vAdds->pArray != (int *)0x0) {
    free(vAdds->pArray);
  }
  free(vAdds);
  if (vRootBoxes->pArray != (int *)0x0) {
    free(vRootBoxes->pArray);
  }
  free(vRootBoxes);
  return;
}

Assistant:

void Acec_ManPool( Gia_Man_t * p )
{
    Vec_Int_t * vTops, * vTree;
    Vec_Wec_t * vTrees;

    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int i, nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d FAs and %d HAs.  ", nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d FAs and %d HAs.  ", nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    //Ree_ManPrintAdders( vAdds, 1 );

    // detect topmost nodes
    vTops = Acec_ManPoolTopMost( p, vAdds );
    printf( "Detected %d topmost adder%s.\n", Vec_IntSize(vTops), Vec_IntSize(vTops) > 1 ? "s":"" );

    // collect adder trees
    vTrees = Gia_PolynCoreOrderArray( p, vAdds, vTops );
    Vec_WecForEachLevel( vTrees, vTree, i )
        printf( "Adder %5d : Tree with %5d nodes.\n", Vec_IntEntry(vTops, i), Vec_IntSize(vTree) );

    Vec_WecFree( vTrees );
    Vec_IntFree( vAdds );
    Vec_IntFree( vTops );
}